

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmSystemTools.cxx
# Opt level: O3

bool cmSystemTools::CreateSymlink(string *origName,string *newName,string *errorMessage)

{
  int err;
  long *plVar1;
  long *plVar2;
  size_type *psVar3;
  string e;
  uv_fs_t req;
  string local_238;
  long *local_218;
  long local_210;
  long local_208;
  long lStack_200;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_1f8;
  uv_fs_t local_1d8;
  
  err = uv_fs_symlink((uv_loop_t *)0x0,&local_1d8,(origName->_M_dataplus)._M_p,
                      (newName->_M_dataplus)._M_p,0,(uv_fs_cb)0x0);
  if (err != 0) {
    std::operator+(&local_1f8,"failed to create symbolic link \'",newName);
    plVar1 = (long *)std::__cxx11::string::append((char *)&local_1f8);
    plVar2 = plVar1 + 2;
    if ((long *)*plVar1 == plVar2) {
      local_208 = *plVar2;
      lStack_200 = plVar1[3];
      local_218 = &local_208;
    }
    else {
      local_208 = *plVar2;
      local_218 = (long *)*plVar1;
    }
    local_210 = plVar1[1];
    *plVar1 = (long)plVar2;
    plVar1[1] = 0;
    *(undefined1 *)(plVar1 + 2) = 0;
    uv_strerror(err);
    plVar1 = (long *)std::__cxx11::string::append((char *)&local_218);
    psVar3 = (size_type *)(plVar1 + 2);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)*plVar1 ==
        (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)psVar3) {
      local_238.field_2._M_allocated_capacity = *psVar3;
      local_238.field_2._8_8_ = plVar1[3];
      local_238._M_dataplus._M_p = (pointer)&local_238.field_2;
    }
    else {
      local_238.field_2._M_allocated_capacity = *psVar3;
      local_238._M_dataplus._M_p = (pointer)*plVar1;
    }
    local_238._M_string_length = plVar1[1];
    *plVar1 = (long)psVar3;
    plVar1[1] = 0;
    *(undefined1 *)(plVar1 + 2) = 0;
    if (local_218 != &local_208) {
      operator_delete(local_218,local_208 + 1);
    }
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_1f8._M_dataplus._M_p != &local_1f8.field_2) {
      operator_delete(local_1f8._M_dataplus._M_p,local_1f8.field_2._M_allocated_capacity + 1);
    }
    if (errorMessage == (string *)0x0) {
      Error(&local_238);
    }
    else {
      std::__cxx11::string::operator=((string *)errorMessage,(string *)&local_238);
    }
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_238._M_dataplus._M_p != &local_238.field_2) {
      operator_delete(local_238._M_dataplus._M_p,local_238.field_2._M_allocated_capacity + 1);
    }
  }
  return err == 0;
}

Assistant:

bool cmSystemTools::CreateSymlink(const std::string& origName,
                                  const std::string& newName,
                                  std::string* errorMessage)
{
  uv_fs_t req;
  int flags = 0;
#if defined(_WIN32)
  if (cmsys::SystemTools::FileIsDirectory(origName)) {
    flags |= UV_FS_SYMLINK_DIR;
  }
#endif
  int err = uv_fs_symlink(nullptr, &req, origName.c_str(), newName.c_str(),
                          flags, nullptr);
  if (err) {
    std::string e =
      "failed to create symbolic link '" + newName + "': " + uv_strerror(err);
    if (errorMessage) {
      *errorMessage = std::move(e);
    } else {
      cmSystemTools::Error(e);
    }
    return false;
  }

  return true;
}